

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O2

void ProcessEDMapthing(FMapThing *mt,int recordnum)

{
  undefined8 uVar1;
  short sVar2;
  EDMapthing *pEVar3;
  FDoomEdEntry *pFVar4;
  
  InitED();
  pEVar3 = TMap<int,_EDMapthing,_THashTraits<int>,_TValueTraits<EDMapthing>_>::CheckKey
                     (&EDThings,recordnum);
  if (pEVar3 == (EDMapthing *)0x0) {
    Printf("EDF Mapthing record %d not found\n",recordnum);
    mt->EdNum = 0;
  }
  else {
    mt->thingid = pEVar3->tid;
    sVar2 = (short)pEVar3->type;
    mt->EdNum = sVar2;
    pFVar4 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,(int)sVar2);
    mt->info = pFVar4;
    (mt->pos).Z = pEVar3->height;
    mt->args[4] = pEVar3->args[4];
    uVar1 = *(undefined8 *)(pEVar3->args + 2);
    *(undefined8 *)mt->args = *(undefined8 *)pEVar3->args;
    *(undefined8 *)(mt->args + 2) = uVar1;
    mt->SkillFilter = pEVar3->skillfilter;
    mt->flags = pEVar3->flags;
  }
  return;
}

Assistant:

void ProcessEDMapthing(FMapThing *mt, int recordnum)
{
	InitED();

	EDMapthing *emt = EDThings.CheckKey(recordnum);
	if (emt == NULL)
	{
		Printf("EDF Mapthing record %d not found\n", recordnum);
		mt->EdNum = 0;
		return;
	}
	mt->thingid = emt->tid;
	mt->EdNum = emt->type;
	mt->info = DoomEdMap.CheckKey(mt->EdNum);
	mt->pos.Z = emt->height;
	memcpy(mt->args, emt->args, sizeof(mt->args));
	mt->SkillFilter = emt->skillfilter;
	mt->flags = emt->flags;
}